

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O2

char * __thiscall
cmCommandArgumentParserHelper::ExpandVariableForAt(cmCommandArgumentParserHelper *this,char *var)

{
  char *pcVar1;
  string ref;
  allocator<char> local_39;
  string local_38;
  
  if (this->ReplaceAtSyntax == true) {
    pcVar1 = ExpandVariable(this,var);
    if (pcVar1 != (char *)0x0) {
      return pcVar1;
    }
    if (this->RemoveEmpty == true) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
      pcVar1 = AddString(this,&local_38);
      goto LAB_002dabfa;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"@",&local_39);
  std::__cxx11::string::append((char *)&local_38);
  std::__cxx11::string::append((char *)&local_38);
  pcVar1 = AddString(this,&local_38);
LAB_002dabfa:
  std::__cxx11::string::~string((string *)&local_38);
  return pcVar1;
}

Assistant:

const char* cmCommandArgumentParserHelper::ExpandVariableForAt(const char* var)
{
  if (this->ReplaceAtSyntax) {
    // try to expand the variable
    const char* ret = this->ExpandVariable(var);
    // if the return was 0 and we want to replace empty strings
    // then return an empty string
    if (!ret && this->RemoveEmpty) {
      return this->AddString("");
    }
    // if the ret was not 0, then return it
    if (ret) {
      return ret;
    }
  }
  // at this point we want to put it back because of one of these cases:
  // - this->ReplaceAtSyntax is false
  // - this->ReplaceAtSyntax is true, but this->RemoveEmpty is false,
  //   and the variable was not defined
  std::string ref = "@";
  ref += var;
  ref += "@";
  return this->AddString(ref);
}